

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tydra *this,VertexAttributeFormat f)

{
  VertexAttributeFormat f_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bool");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int8");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int8x2");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int8x3");
    break;
  case 4:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int8x4");
    break;
  case 5:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint8");
    break;
  case 6:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint8x2");
    break;
  case 7:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint8x3");
    break;
  case 8:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint8x4");
    break;
  case 9:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int16");
    break;
  case 10:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int16x2");
    break;
  case 0xb:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int16x2");
    break;
  case 0xc:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int16x2");
    break;
  case 0xd:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint16");
    break;
  case 0xe:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint16x2");
    break;
  case 0xf:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint16x2");
    break;
  case 0x10:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint16x2");
    break;
  case 0x11:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"half");
    break;
  case 0x12:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"half2");
    break;
  case 0x13:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"half3");
    break;
  case 0x14:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"half4");
    break;
  case 0x15:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float");
    break;
  case 0x16:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float2");
    break;
  case 0x17:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float3");
    break;
  case 0x18:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float4");
    break;
  case 0x19:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int");
    break;
  case 0x1a:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int2");
    break;
  case 0x1b:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int3");
    break;
  case 0x1c:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int4");
    break;
  case 0x1d:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint");
    break;
  case 0x1e:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint2");
    break;
  case 0x1f:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint3");
    break;
  case 0x20:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint4");
    break;
  case 0x21:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double");
    break;
  case 0x22:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double2");
    break;
  case 0x23:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double3");
    break;
  case 0x24:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double4");
    break;
  case 0x25:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat2");
    break;
  case 0x26:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat3");
    break;
  case 0x27:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat4");
    break;
  case 0x28:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dmat2");
    break;
  case 0x29:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dmat3");
    break;
  case 0x2a:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dmat4");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(VertexAttributeFormat f) {
  std::string s;

  switch (f) {
    case VertexAttributeFormat::Bool: {
      s = "bool";
      break;
    }
    case VertexAttributeFormat::Char: {
      s = "int8";
      break;
    }
    case VertexAttributeFormat::Char2: {
      s = "int8x2";
      break;
    }
    case VertexAttributeFormat::Char3: {
      s = "int8x3";
      break;
    }
    case VertexAttributeFormat::Char4: {
      s = "int8x4";
      break;
    }
    case VertexAttributeFormat::Byte: {
      s = "uint8";
      break;
    }
    case VertexAttributeFormat::Byte2: {
      s = "uint8x2";
      break;
    }
    case VertexAttributeFormat::Byte3: {
      s = "uint8x3";
      break;
    }
    case VertexAttributeFormat::Byte4: {
      s = "uint8x4";
      break;
    }
    case VertexAttributeFormat::Short: {
      s = "int16";
      break;
    }
    case VertexAttributeFormat::Short2: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Short3: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Short4: {
      s = "int16x2";
      break;
    }
    case VertexAttributeFormat::Ushort: {
      s = "uint16";
      break;
    }
    case VertexAttributeFormat::Ushort2: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Ushort3: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Ushort4: {
      s = "uint16x2";
      break;
    }
    case VertexAttributeFormat::Half: {
      s = "half";
      break;
    }
    case VertexAttributeFormat::Half2: {
      s = "half2";
      break;
    }
    case VertexAttributeFormat::Half3: {
      s = "half3";
      break;
    }
    case VertexAttributeFormat::Half4: {
      s = "half4";
      break;
    }
    case VertexAttributeFormat::Float: {
      s = "float";
      break;
    }
    case VertexAttributeFormat::Vec2: {
      s = "float2";
      break;
    }
    case VertexAttributeFormat::Vec3: {
      s = "float3";
      break;
    }
    case VertexAttributeFormat::Vec4: {
      s = "float4";
      break;
    }
    case VertexAttributeFormat::Int: {
      s = "int";
      break;
    }
    case VertexAttributeFormat::Ivec2: {
      s = "int2";
      break;
    }
    case VertexAttributeFormat::Ivec3: {
      s = "int3";
      break;
    }
    case VertexAttributeFormat::Ivec4: {
      s = "int4";
      break;
    }
    case VertexAttributeFormat::Uint: {
      s = "uint";
      break;
    }
    case VertexAttributeFormat::Uvec2: {
      s = "uint2";
      break;
    }
    case VertexAttributeFormat::Uvec3: {
      s = "uint3";
      break;
    }
    case VertexAttributeFormat::Uvec4: {
      s = "uint4";
      break;
    }
    case VertexAttributeFormat::Double: {
      s = "double";
      break;
    }
    case VertexAttributeFormat::Dvec2: {
      s = "double2";
      break;
    }
    case VertexAttributeFormat::Dvec3: {
      s = "double3";
      break;
    }
    case VertexAttributeFormat::Dvec4: {
      s = "double4";
      break;
    }
    case VertexAttributeFormat::Mat2: {
      s = "mat2";
      break;
    }
    case VertexAttributeFormat::Mat3: {
      s = "mat3";
      break;
    }
    case VertexAttributeFormat::Mat4: {
      s = "mat4";
      break;
    }
    case VertexAttributeFormat::Dmat2: {
      s = "dmat2";
      break;
    }
    case VertexAttributeFormat::Dmat3: {
      s = "dmat3";
      break;
    }
    case VertexAttributeFormat::Dmat4: {
      s = "dmat4";
      break;
    }
  }

  return s;
}